

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

double __thiscall spdlog::logger::log(logger *this,double __x)

{
  bool bVar1;
  bool bVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  undefined8 in_stack_00000010;
  log_msg *in_stack_00000018;
  log_msg log_msg;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string_view<char> *in_stack_ffffffffffffff20;
  logger *in_stack_ffffffffffffff28;
  logger *in_stack_ffffffffffffff30;
  level_enum in_stack_ffffffffffffff8c;
  log_msg *in_stack_ffffffffffffff90;
  string_view_t in_stack_ffffffffffffff98;
  string_view_t in_stack_ffffffffffffffa8;
  source_loc in_stack_ffffffffffffffc0;
  
  bVar1 = should_log(in_stack_ffffffffffffff28,
                     (level_enum)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  bVar2 = details::backtracer::enabled((backtracer *)0x1251e3);
  if ((bVar1) || (dVar3 = extraout_XMM0_Qa, bVar2)) {
    ::fmt::v7::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    details::log_msg::log_msg
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff98);
    log_it_(in_stack_ffffffffffffff30,in_stack_00000018,
            SUB21((ushort)in_stack_00000010._6_2_ >> 8,0),SUB21(in_stack_00000010._6_2_,0));
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t msg)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }

        details::log_msg log_msg(loc, name_, lvl, msg);
        log_it_(log_msg, log_enabled, traceback_enabled);
    }